

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeMerging.cpp
# Opt level: O1

bool wasm::anon_unknown_0::shapeEq(HeapType a,HeapType b)

{
  pointer pFVar1;
  pointer pFVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  Struct *pSVar6;
  Struct *pSVar7;
  long lVar8;
  ulong uVar9;
  Signature SVar10;
  Signature SVar11;
  HeapType local_60;
  long local_58;
  HeapType local_50;
  long local_48;
  HeapType local_40;
  HeapType a_local;
  HeapType b_local;
  
  local_40.id = a.id;
  a_local = b;
  bVar4 = HeapType::isStruct(&local_40);
  if ((bVar4) && (bVar4 = HeapType::isStruct(&a_local), bVar4)) {
    pSVar6 = HeapType::getStruct(&local_40);
    pSVar7 = HeapType::getStruct(&a_local);
    pFVar1 = (pSVar6->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
             super__Vector_impl_data._M_start;
    pFVar2 = (pSVar6->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((long)pFVar2 - (long)pFVar1 ==
        (long)(pSVar7->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl
              .super__Vector_impl_data._M_finish -
        (long)(pSVar7->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl
              .super__Vector_impl_data._M_start) {
      bVar4 = pFVar2 == pFVar1;
      if (bVar4) {
        return bVar4;
      }
      lVar8._0_4_ = pFVar1->packedType;
      lVar8._4_4_ = pFVar1->mutable_;
      pFVar2 = (pSVar7->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar3._0_4_ = pFVar2->packedType;
      lVar3._4_4_ = pFVar2->mutable_;
      if (lVar8 != lVar3) {
        return bVar4;
      }
      bVar5 = shapeEq((Type)(pFVar1->type).id,(Type)(pFVar2->type).id);
      if (!bVar5) {
        return bVar4;
      }
      uVar9 = 0;
      lVar8 = 0x18;
      while( true ) {
        uVar9 = uVar9 + 1;
        pFVar1 = (pSVar6->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        bVar4 = (ulong)((long)(pSVar6->fields).
                              super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)pFVar1 >> 4) <= uVar9;
        if (bVar4) {
          return bVar4;
        }
        pFVar2 = (pSVar7->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (*(long *)((long)&(pFVar1->type).id + lVar8) !=
            *(long *)((long)&(pFVar2->type).id + lVar8)) break;
        bVar5 = shapeEq((Type)*(uintptr_t *)((long)pFVar1 + lVar8 + -8),
                        (Type)*(uintptr_t *)((long)pFVar2 + lVar8 + -8));
        lVar8 = lVar8 + 0x10;
        if (!bVar5) {
          return bVar4;
        }
      }
      return bVar4;
    }
  }
  else {
    bVar4 = HeapType::isArray(&local_40);
    if ((bVar4) && (bVar4 = HeapType::isArray(&a_local), bVar4)) {
      HeapType::getArray(&local_60);
      HeapType::getArray(&local_50);
      if (local_58 == local_48) {
LAB_008d001d:
        bVar4 = shapeEq((Type)local_60.id,(Type)local_50.id);
        return bVar4;
      }
    }
    else {
      bVar4 = HeapType::isSignature(&local_40);
      if ((bVar4) && (bVar4 = HeapType::isSignature(&a_local), bVar4)) {
        SVar10 = HeapType::getSignature(&local_40);
        SVar11 = HeapType::getSignature(&a_local);
        bVar4 = shapeEq(SVar10.params.id,SVar11.params.id);
        local_50.id = SVar11.results.id.id;
        local_60.id = SVar10.results.id.id;
        if (bVar4) goto LAB_008d001d;
      }
    }
  }
  return false;
}

Assistant:

bool shapeEq(HeapType a, HeapType b) {
  // Check whether `a` and `b` have the same top-level structure, including the
  // position and identity of any children that are not included as transitions
  // in the DFA, i.e. any children that are not nontrivial references.
  if (a.isStruct() && b.isStruct()) {
    return shapeEq(a.getStruct(), b.getStruct());
  }
  if (a.isArray() && b.isArray()) {
    return shapeEq(a.getArray(), b.getArray());
  }
  if (a.isSignature() && b.isSignature()) {
    return shapeEq(a.getSignature(), b.getSignature());
  }
  return false;
}